

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,
          TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *cp)

{
  TPZVec<long> *in_RDI;
  TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *in_stack_00000018;
  TPZGeoMesh *in_stack_00000020;
  void **in_stack_00000028;
  TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *in_stack_00000030;
  int64_t *this_00;
  pointer_____offset_0x60___ *copy;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy = &TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>>::VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0246c838);
  TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefLess
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_0246c510;
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZGeoElRefPattern_0246c510;
  this_00 = &in_RDI[9].fNElements;
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)this_00,
             (TPZAutoPointer<TPZRefPattern> *)&in_RDI[10].fNElements);
  TPZVec<long>::operator=(in_RDI,(TPZVec<long> *)copy);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}